

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint32_t __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  byte *pbVar1;
  long lVar2;
  byte *pbVar3;
  byte v2;
  int iVar4;
  uint uVar5;
  Nonnull<const_char_*> pcVar6;
  int iVar7;
  uint32_t uVar9;
  long lVar10;
  byte *pbVar11;
  bool bVar12;
  LogMessage LStack_28;
  int iVar8;
  
  iVar4 = (int)this->buffer_;
  iVar8 = (int)this->buffer_end_;
  iVar7 = iVar8 - iVar4;
  if ((iVar7 < 10) && ((iVar7 < 1 || ((char)this->buffer_end_[-1] < '\0')))) {
    if ((iVar8 == iVar4) &&
       (((0 < this->buffer_size_after_limit_ || (this->total_bytes_read_ == this->current_limit_))
        && (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_))))
    {
      this->legitimate_message_end_ = true;
      return 0;
    }
    uVar9 = ReadTagSlow(this);
    return uVar9;
  }
  v2 = *this->buffer_;
  if (v2 == first_byte_or_zero) {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_char>
                       ((ulong)first_byte_or_zero,v2,"first_byte_or_zero == buffer_[0]");
  }
  if (pcVar6 == (Nonnull<const_char_*>)0x0) {
    pbVar11 = this->buffer_;
    if (first_byte_or_zero == 0) {
      this->buffer_ = pbVar11 + 1;
      return 0;
    }
    if (*pbVar11 == first_byte_or_zero) {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_char,long>
                         (*pbVar11,(ulong)first_byte_or_zero,"*buffer == first_byte");
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      if ((first_byte_or_zero & 0x80) == 0) {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (0,0x80,"first_byte & 0x80 == 0x80");
      }
      else {
        pcVar6 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar6 == (Nonnull<const_char_*>)0x0) {
        uVar9 = ((uint)pbVar11[1] * 0x80 + first_byte_or_zero) - 0x80;
        bVar12 = true;
        if ((char)pbVar11[1] < '\0') {
          uVar9 = (uVar9 + (uint)pbVar11[2] * 0x4000) - 0x4000;
          if ((char)pbVar11[2] < '\0') {
            uVar9 = (uVar9 + (uint)pbVar11[3] * 0x200000) - 0x200000;
            if ((char)pbVar11[3] < '\0') {
              uVar9 = uVar9 + (uint)pbVar11[4] * 0x10000000 + 0xf0000000;
              if ((char)pbVar11[4] < '\0') {
                pbVar1 = pbVar11 + 6;
                if ((char)pbVar11[5] < '\0') {
                  pbVar11 = pbVar11 + 10;
                  lVar10 = 0;
                  do {
                    uVar5 = (uint)lVar10;
                    if (uVar5 == 4) goto LAB_00fd27d3;
                    lVar2 = lVar10 + 1;
                    pbVar3 = pbVar1 + lVar10;
                    lVar10 = lVar2;
                  } while ((char)*pbVar3 < '\0');
                  pbVar11 = pbVar1 + lVar2;
LAB_00fd27d3:
                  bVar12 = 3 < uVar5;
                }
                else {
                  bVar12 = false;
                  pbVar11 = pbVar1;
                }
                bVar12 = (bool)(bVar12 ^ 1);
              }
              else {
                pbVar11 = pbVar11 + 5;
              }
            }
            else {
              pbVar11 = pbVar11 + 4;
            }
          }
          else {
            pbVar11 = pbVar11 + 3;
          }
        }
        else {
          pbVar11 = pbVar11 + 2;
        }
        if (bVar12) {
          this->buffer_ = pbVar11;
          return uVar9;
        }
        return 0;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x1af,pcVar6);
      absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_28,first_byte_or_zero);
      goto LAB_00fd283d;
    }
  }
  else {
    ReadTagFallback();
  }
  ReadTagFallback();
LAB_00fd283d:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28)
  ;
}

Assistant:

uint32_t CodedInputStream::ReadTagFallback(uint32_t first_byte_or_zero) {
  const int buf_size = BufferSize();
  if (buf_size >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buf_size > 0 && !(buffer_end_[-1] & 0x80))) {
    ABSL_DCHECK_EQ(first_byte_or_zero, buffer_[0]);
    if (first_byte_or_zero == 0) {
      ++buffer_;
      return 0;
    }
    uint32_t tag;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &tag);
    if (!p.first) {
      return 0;
    }
    buffer_ = p.second;
    return tag;
  } else {
    // We are commonly at a limit when attempting to read tags. Try to quickly
    // detect this case without making another function call.
    if ((buf_size == 0) &&
        ((buffer_size_after_limit_ > 0) ||
         (total_bytes_read_ == current_limit_)) &&
        // Make sure that the limit we hit is not total_bytes_limit_, since
        // in that case we still need to call Refresh() so that it prints an
        // error.
        total_bytes_read_ - buffer_size_after_limit_ < total_bytes_limit_) {
      // We hit a byte limit.
      legitimate_message_end_ = true;
      return 0;
    }
    return ReadTagSlow();
  }
}